

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmDirectoryId * __thiscall
cmMakefile::GetDirectoryId(cmDirectoryId *__return_storage_ptr__,cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char buf [32];
  allocator<char> local_59;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  char local_38 [32];
  
  sprintf(local_38,"<%p>",this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,local_38,&local_59);
  paVar1 = &(__return_storage_ptr__->String).field_2;
  (__return_storage_ptr__->String)._M_dataplus._M_p = (pointer)paVar1;
  if (local_58 == &local_48) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&(__return_storage_ptr__->String).field_2 + 8) = uStack_40;
  }
  else {
    (__return_storage_ptr__->String)._M_dataplus._M_p = local_58;
    (__return_storage_ptr__->String).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  (__return_storage_ptr__->String)._M_string_length = local_50;
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

cmDirectoryId cmMakefile::GetDirectoryId() const
{
  // Use the instance pointer value to uniquely identify this directory.
  // If we ever need to expose this to CMake language code we should
  // add a read-only property in cmMakefile::GetProperty.
  char buf[32];
  sprintf(buf, "<%p>",
          static_cast<void const*>(this)); // cast avoids format warning
  return std::string(buf);
}